

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::mrg2>(mrg2 *r)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  string res;
  string local_50;
  double local_30;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  iVar3 = 0;
  lVar2 = 0x1000000;
  iVar6 = (r->S).r[0];
  iVar4 = (r->S).r[1];
  do {
    iVar5 = iVar6;
    uVar7 = (long)iVar4 * (long)(r->P).a[1] + (long)iVar5 * (long)(r->P).a[0];
    uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
    uVar7 = uVar8 - 0xfffffffe;
    if (uVar8 < 0xfffffffe) {
      uVar7 = uVar8;
    }
    iVar6 = (int)uVar7 + -0x7fffffff;
    if (uVar7 < 0x7fffffff) {
      iVar6 = (int)uVar7;
    }
    iVar3 = iVar3 + iVar6;
    lVar2 = lVar2 + -1;
    iVar4 = iVar5;
  } while (lVar2 != 0);
  (r->S).r[0] = iVar6;
  (r->S).r[1] = iVar5;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_30 = 16.777216 / ((double)((lVar2 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_50,&local_30);
  while (local_50._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar3;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}